

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

bool __thiscall QRegularExpressionMatch::hasCaptured(QRegularExpressionMatch *this,int nth)

{
  QRegularExpressionMatchPrivate *pQVar1;
  
  if ((-1 < nth) && (pQVar1 = (this->d).d.ptr, nth < pQVar1->capturedCount)) {
    return (pQVar1->capturedOffsets).d.ptr[(uint)(nth * 2)] != -1;
  }
  return false;
}

Assistant:

bool QRegularExpressionMatch::hasCaptured(int nth) const
{
    if (nth < 0 || nth > lastCapturedIndex())
        return false;

    return d->capturedOffsets.at(nth * 2) != -1;
}